

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O1

pair<bool,_dg::LLVMPointsToSet> __thiscall
dg::DGLLVMPointerAnalysis::getLLVMPointsToChecked(DGLLVMPointerAnalysis *this,Value *val)

{
  PSNode *pPVar1;
  DGLLVMPointsToSet *this_00;
  PointsToSetT *S;
  Value *in_RDX;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> extraout_RDX;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> extraout_RDX_00
  ;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> uVar2;
  pair<bool,_dg::LLVMPointsToSet> pVar3;
  
  pPVar1 = pta::LLVMPointerGraphBuilder::getPointsToNode
                     (*(LLVMPointerGraphBuilder **)(val + 0x88),in_RDX);
  if ((pPVar1 == (PSNode *)0x0) || (*(long *)(pPVar1 + 200) == 0)) {
    this_00 = (DGLLVMPointsToSet *)operator_new(0x30);
    S = getUnknownPTSet();
    DGLLVMPointsToSet::DGLLVMPointsToSet(this_00,S);
    *(undefined1 *)&(this->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis = 0;
    uVar2._M_t.
    super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
    _M_t.
    super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
    .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
         extraout_RDX_00._M_t.
         super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
  }
  else {
    this_00 = (DGLLVMPointsToSet *)operator_new(0x30);
    DGLLVMPointsToSet::DGLLVMPointsToSet(this_00,(PointsToSetT *)(pPVar1 + 0xb0));
    *(undefined1 *)&(this->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis = 1;
    uVar2._M_t.
    super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
    _M_t.
    super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
    .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
         extraout_RDX._M_t.
         super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
  }
  (this->super_LLVMPointerAnalysis).options.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p
       = (pointer)this_00;
  pVar3.second._impl._M_t.
  super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
  super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
       (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)
       (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)
       uVar2._M_t.
       super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
       .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
  pVar3._0_8_ = this;
  return pVar3;
}

Assistant:

std::pair<bool, LLVMPointsToSet>
    getLLVMPointsToChecked(const llvm::Value *val) override {
        DGLLVMPointsToSet *pts;
        if (auto *node = getPointsToNode(val)) {
            if (node->pointsTo.empty()) {
                pts = new DGLLVMPointsToSet(getUnknownPTSet());
                return {false, pts->toLLVMPointsToSet()};
            }
            pts = new DGLLVMPointsToSet(node->pointsTo);
            return {true, pts->toLLVMPointsToSet()};
        }
        pts = new DGLLVMPointsToSet(getUnknownPTSet());
        return {false, pts->toLLVMPointsToSet()};
    }